

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DCtx * ZSTD_initStaticDCtx(void *workspace,size_t workspaceSize)

{
  ulong in_RSI;
  ZSTD_DCtx *in_RDI;
  ZSTD_DCtx *dctx;
  ZSTD_DCtx *local_8;
  
  if (((ulong)in_RDI & 7) == 0) {
    if (in_RSI < 0x176e0) {
      local_8 = (ZSTD_DCtx *)0x0;
    }
    else {
      ZSTD_initDCtx_internal((ZSTD_DCtx *)0x2f2b02);
      in_RDI->staticSize = in_RSI;
      in_RDI->inBuff = (char *)(in_RDI + 1);
      local_8 = in_RDI;
    }
  }
  else {
    local_8 = (ZSTD_DCtx *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_DCtx* ZSTD_initStaticDCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_DCtx* const dctx = (ZSTD_DCtx*) workspace;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < sizeof(ZSTD_DCtx)) return NULL;  /* minimum size */

    ZSTD_initDCtx_internal(dctx);
    dctx->staticSize = workspaceSize;
    dctx->inBuff = (char*)(dctx+1);
    return dctx;
}